

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserFormatter.cpp
# Opt level: O0

void __thiscall
cali::UserFormatter::UserFormatter(UserFormatter *this,OutputStream *os,QuerySpec *spec)

{
  bool bVar1;
  FormatImpl *this_00;
  element_type *this_01;
  ostream *poVar2;
  pointer ppVar3;
  ostream *real_os;
  allocator<char> local_59;
  key_type local_58;
  _Self local_38;
  const_iterator it;
  QuerySpec *spec_local;
  OutputStream *os_local;
  UserFormatter *this_local;
  
  Formatter::Formatter(&this->super_Formatter);
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__UserFormatter_0054ef68;
  this_00 = (FormatImpl *)operator_new(0x98);
  FormatImpl::FormatImpl(this_00,os);
  std::shared_ptr<cali::UserFormatter::FormatImpl>::shared_ptr<cali::UserFormatter::FormatImpl,void>
            (&this->mP,this_00);
  this_01 = std::
            __shared_ptr_access<cali::UserFormatter::FormatImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cali::UserFormatter::FormatImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mP);
  FormatImpl::configure(this_01,spec);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"title",&local_59);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&(spec->format).kwargs,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  real_os = (ostream *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(&(spec->format).kwargs);
  bVar1 = std::operator!=(&local_38,(_Self *)&real_os);
  if (bVar1) {
    poVar2 = OutputStream::stream(os);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_38);
    poVar2 = std::operator<<(poVar2,(string *)&ppVar3->second);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

UserFormatter::UserFormatter(OutputStream& os, const QuerySpec& spec) : mP { new FormatImpl(os) }
{
    mP->configure(spec);

    {
        auto it = spec.format.kwargs.find("title");
        if (it != spec.format.kwargs.end()) {
            std::ostream* real_os = os.stream();
            *real_os << it->second << std::endl;
        }
    }
}